

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::Log(cmCTest *this,int logType,char *file,int line,char *msg,bool suppress)

{
  char cVar1;
  byte bVar2;
  ostream *poVar3;
  ostream *poVar4;
  byte bVar5;
  char *pcVar6;
  cmGeneratedFileStream *pcVar7;
  
  if (msg == (char *)0x0) {
    return;
  }
  if (logType != 6 && suppress) {
    return;
  }
  if (*msg == '\0') {
    return;
  }
  if (logType == 3) {
    if (this->Debug != false) {
      return;
    }
    if (this->ExtraVerbose != false) {
      return;
    }
  }
  pcVar7 = this->OutputLogFile;
  if (pcVar7 != (cmGeneratedFileStream *)0x0) {
    bVar2 = logType != 0 | this->Debug;
    bVar5 = this->ExtraVerbose;
    if ((this->Debug & 1U) != 0) {
      bVar5 = bVar2;
    }
    if (logType != 4) {
      bVar5 = bVar2;
    }
    if ((bVar5 & 1) != 0) {
      if (this->ShowLineNumbers == true) {
        poVar3 = std::endl<char,std::char_traits<char>>((ostream *)pcVar7);
        poVar3 = std::operator<<(poVar3,file);
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
        std::operator<<(poVar3," ");
        pcVar7 = this->OutputLogFile;
      }
      if (this->OutputLogFileLastTag != logType) {
        std::operator<<((ostream *)pcVar7,"[");
        if ((uint)logType < 7) {
          pcVar6 = cmCTestStringLogType[(uint)logType];
        }
        else {
          pcVar6 = "OTHER";
        }
        std::operator<<((ostream *)this->OutputLogFile,pcVar6);
        poVar3 = std::operator<<((ostream *)this->OutputLogFile,"] ");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::ostream::flush();
        pcVar7 = this->OutputLogFile;
      }
      std::operator<<((ostream *)pcVar7,msg);
      std::ostream::flush();
      if (this->OutputLogFileLastTag != logType) {
        std::endl<char,std::char_traits<char>>((ostream *)this->OutputLogFile);
        std::ostream::flush();
        this->OutputLogFileLastTag = logType;
      }
    }
  }
  if (this->Quiet != false) {
    return;
  }
  poVar3 = this->StreamOut;
  if ((uint)logType < 7) {
    poVar4 = this->StreamErr;
    switch((ulong)(uint)logType) {
    case 0:
      cVar1 = this->Debug;
joined_r0x002d8d37:
      if (cVar1 != '\x01') {
        return;
      }
      break;
    default:
      if (this->Debug == false) {
        cVar1 = this->Verbose;
        goto joined_r0x002d8d37;
      }
      break;
    case 3:
      break;
    case 4:
      if (this->Debug == false) {
        cVar1 = this->ExtraVerbose;
        goto joined_r0x002d8d37;
      }
      break;
    case 5:
      if (this->ShowLineNumbers == true) {
        poVar3 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar3 = std::operator<<(poVar3,file);
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
        std::operator<<(poVar3," ");
      }
      std::operator<<(poVar4,msg);
      goto LAB_002d8dee;
    case 6:
      if (this->ShowLineNumbers == true) {
        poVar3 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar3 = std::operator<<(poVar3,file);
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
        std::operator<<(poVar3," ");
      }
      std::operator<<(poVar4,msg);
      std::ostream::flush();
      cmSystemTools::s_ErrorOccured = true;
      return;
    }
  }
  if (this->ShowLineNumbers == true) {
    poVar4 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar4 = std::operator<<(poVar4,file);
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,line);
    std::operator<<(poVar4," ");
  }
  std::operator<<(poVar3,msg);
LAB_002d8dee:
  std::ostream::flush();
  return;
}

Assistant:

void cmCTest::Log(int logType, const char* file, int line, const char* msg,
                  bool suppress)
{
  if (!msg || !*msg) {
    return;
  }
  if (suppress && logType != cmCTest::ERROR_MESSAGE) {
    return;
  }
  if (logType == cmCTest::HANDLER_PROGRESS_OUTPUT &&
      (this->Debug || this->ExtraVerbose)) {
    return;
  }
  if (this->OutputLogFile) {
    bool display = true;
    if (logType == cmCTest::DEBUG && !this->Debug) {
      display = false;
    }
    if (logType == cmCTest::HANDLER_VERBOSE_OUTPUT && !this->Debug &&
        !this->ExtraVerbose) {
      display = false;
    }
    if (display) {
      cmCTestLogOutputFileLine(*this->OutputLogFile);
      if (logType != this->OutputLogFileLastTag) {
        *this->OutputLogFile << "[";
        if (logType >= OTHER || logType < 0) {
          *this->OutputLogFile << "OTHER";
        } else {
          *this->OutputLogFile << cmCTestStringLogType[logType];
        }
        *this->OutputLogFile << "] " << std::endl << std::flush;
      }
      *this->OutputLogFile << msg << std::flush;
      if (logType != this->OutputLogFileLastTag) {
        *this->OutputLogFile << std::endl << std::flush;
        this->OutputLogFileLastTag = logType;
      }
    }
  }
  if (!this->Quiet) {
    std::ostream& out = *this->StreamOut;
    std::ostream& err = *this->StreamErr;
    switch (logType) {
      case DEBUG:
        if (this->Debug) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case OUTPUT:
      case HANDLER_OUTPUT:
        if (this->Debug || this->Verbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case HANDLER_VERBOSE_OUTPUT:
        if (this->Debug || this->ExtraVerbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case WARNING:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        break;
      case ERROR_MESSAGE:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        cmSystemTools::SetErrorOccured();
        break;
      default:
        cmCTestLogOutputFileLine(out);
        out << msg;
        out.flush();
    }
  }
}